

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_MNI_ImportOtherNetworksFail_Test::TestBody
          (InterpreterTestSuite_MNI_ImportOtherNetworksFail_Test *this)

{
  Registry *pRVar1;
  bool bVar2;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *expected_predicate_value;
  char *pcVar3;
  Status local_4c2;
  allocator local_4c1;
  allocator local_4c0;
  allocator local_4bf;
  allocator local_4be;
  allocator local_4bd;
  allocator local_4bc;
  allocator local_4bb;
  allocator local_4ba;
  Status local_4b9;
  AssertionResult gtest_ar_1;
  Expression expr;
  Value value;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_438;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_418;
  State local_3f4;
  State local_3f0;
  State local_3ec;
  Value local_3e8;
  string local_3a0;
  string local_380;
  AssertionResult gtest_ar_;
  string local_340;
  string local_320;
  UnixTime local_300;
  UnixTime local_2f8;
  UnixTime local_2f0;
  BorderRouter br;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  value.mError.mCode = kNone;
  value.mError._4_4_ = 0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)&br,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&value);
  if ((char)br._vptr_BorderRouter == '\0') {
    testing::Message::Message((Message *)&value);
    if ((undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(br.mNetworkId.mId,br.mId.mId);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0xb42,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3e8,(Message *)&value);
    this_01 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&br.mId;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3e8);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&br.mId);
    pRVar1 = ctx.mRegistry;
    std::__cxx11::string::string((string *)&value,"127.0.0.1",&local_4ba);
    local_418._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_418._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_418._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_3e8,"1.1",&local_4bb);
    ot::commissioner::BorderAgent::State::State(&local_3ec,0,0,0,0,0);
    std::__cxx11::string::string((string *)&expr,"net1",&local_4bc);
    std::__cxx11::string::string((string *)&gtest_ar_,"",&local_4bd);
    std::__cxx11::string::string((string *)&local_3a0,"",&local_4be);
    std::__cxx11::string::string((string *)&local_380,"",&local_4bf);
    local_438._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_438._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_320,"domain1",&local_4c0);
    pcVar3 = "";
    std::__cxx11::string::string((string *)&local_340,"",&local_4c1);
    ot::commissioner::UnixTime::UnixTime(&local_2f0,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&br,(string *)&value,0x4e21,(ByteArray *)&local_418,
               (string *)&local_3e8,local_3ec,(string *)&expr,2,(string *)&gtest_ar_,&local_3a0,
               (Timestamp)0x0,0,&local_380,(ByteArray *)&local_438,&local_320,'\0',0,&local_340,
               local_2f0,0x101f);
    local_4b9 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&br);
    local_4c2 = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&gtest_ar_1,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
               ,"RegistryStatus::kSuccess",&local_4b9,&local_4c2);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_438);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&expr);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_418);
    std::__cxx11::string::~string((string *)&value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&br);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xb46,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
      this_01 = &gtest_ar_1.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if ((long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) != (long *)0x0)
      {
        (**(code **)(*(long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) + 8)
        )();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      pRVar1 = ctx.mRegistry;
      std::__cxx11::string::string((string *)&value,"127.0.0.2",&local_4ba);
      local_418._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_418._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_418._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_3e8,"1.1",&local_4bb);
      ot::commissioner::BorderAgent::State::State(&local_3f0,0,0,0,0,0);
      std::__cxx11::string::string((string *)&expr,"net2",&local_4bc);
      std::__cxx11::string::string((string *)&gtest_ar_,"",&local_4bd);
      std::__cxx11::string::string((string *)&local_3a0,"",&local_4be);
      std::__cxx11::string::string((string *)&local_380,"",&local_4bf);
      local_438._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_438._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_438._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_320,"domain2",&local_4c0);
      pcVar3 = "";
      std::__cxx11::string::string((string *)&local_340,"",&local_4c1);
      ot::commissioner::UnixTime::UnixTime(&local_2f8,0);
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&br,(string *)&value,0x4e22,(ByteArray *)&local_418,
                 (string *)&local_3e8,local_3f0,(string *)&expr,1,(string *)&gtest_ar_,&local_3a0,
                 (Timestamp)0x0,0,&local_380,(ByteArray *)&local_438,&local_320,'\0',0,&local_340,
                 local_2f8,0x101f);
      local_4b9 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&br);
      local_4c2 = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&gtest_ar_1,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",&local_4b9,&local_4c2);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_320);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_438);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      std::__cxx11::string::~string((string *)&expr);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_418);
      std::__cxx11::string::~string((string *)&value);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&br);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&value,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xb4a,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
        this_01 = &gtest_ar_1.message_;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
        if ((long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) != (long *)0x0
           ) {
          (**(code **)(*(long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) +
                      8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_1.message_);
        pRVar1 = ctx.mRegistry;
        std::__cxx11::string::string((string *)&value,"127.0.0.3",&local_4ba);
        local_418._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_418._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_418._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)&local_3e8,"1.1",&local_4bb);
        ot::commissioner::BorderAgent::State::State(&local_3f4,0,0,0,0,0);
        std::__cxx11::string::string((string *)&expr,"net2",&local_4bc);
        std::__cxx11::string::string((string *)&gtest_ar_,"",&local_4bd);
        std::__cxx11::string::string((string *)&local_3a0,"",&local_4be);
        std::__cxx11::string::string((string *)&local_380,"",&local_4bf);
        local_438._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_438._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_438._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)&local_320,"domain2",&local_4c0);
        pcVar3 = "";
        std::__cxx11::string::string((string *)&local_340,"",&local_4c1);
        ot::commissioner::UnixTime::UnixTime(&local_300,0);
        expected_predicate_value = (char *)(ulong)(uint)local_3f4;
        ot::commissioner::BorderAgent::BorderAgent
                  ((BorderAgent *)&br,(string *)&value,0x4e23,(ByteArray *)&local_418,
                   (string *)&local_3e8,local_3f4,(string *)&expr,1,(string *)&gtest_ar_,&local_3a0,
                   (Timestamp)0x0,0,&local_380,(ByteArray *)&local_438,&local_320,'\0',0,&local_340,
                   local_300,0x101f);
        local_4b9 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&br);
        local_4c2 = kSuccess;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&gtest_ar_1,
                   "ctx.mRegistry->Add(BorderAgent{\"127.0.0.3\", 20003, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                   ,"RegistryStatus::kSuccess",&local_4b9,&local_4c2);
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)&local_320);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_438);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        std::__cxx11::string::~string((string *)&expr);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_418);
        std::__cxx11::string::~string((string *)&value);
        if (gtest_ar_1.success_ != false) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_1.message_);
          ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
          ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&value,0);
          br.mNetworkId.mId = value.mError.mCode;
          local_3e8.mError.mCode._0_1_ =
               ot::commissioner::persistent_storage::Registry::SetCurrentNetwork(ctx.mRegistry,&br);
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)expr.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                    ((internal *)&value,"ctx.mRegistry->SetCurrentNetwork(br)",
                     "RegistryStatus::kSuccess",(Status *)&local_3e8,(Status *)&expr);
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)&local_3e8);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&expr,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xb52,pcVar3);
            testing::internal::AssertHelper::operator=((AssertHelper *)&expr,(Message *)&local_3e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr);
            if ((long *)CONCAT71(local_3e8.mError._1_7_,(undefined1)local_3e8.mError.mCode) !=
                (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_3e8.mError._1_7_,
                                             (undefined1)local_3e8.mError.mCode) + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&value.mError.mMessage);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&value.mError.mMessage);
            testing::A<std::shared_ptr<ot::commissioner::CommissionerApp>&>();
            testing::A<ot::commissioner::Config_const&>();
            CommissionerAppStaticExpecter::gmock_Create
                      ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                        *)&value,&ctx.mCommissionerAppStaticExpecter,
                       (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_3e8,
                       (Matcher<const_ot::commissioner::Config_&> *)&expr);
            testing::internal::GetWithoutMatchers();
            this_00 = testing::internal::
                      MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                      ::InternalExpectedAt
                                ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                  *)&value,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                                 ,0xb54,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
            testing::internal::
            TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
            ::Times(this_00,0);
            std::
            _Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
            ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                            *)&value.mError.mMessage);
            testing::internal::MatcherBase<const_ot::commissioner::Config_&>::~MatcherBase
                      ((MatcherBase<const_ot::commissioner::Config_&> *)&expr);
            testing::internal::MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::
            ~MatcherBase((MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                         &local_3e8);
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
            value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
            value.mError.mMessage._M_string_length = 0;
            value.mError.mMessage.field_2._M_local_buf[0] = '\0';
            value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
            value.mData._M_string_length = 0;
            value.mData.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::string
                      ((string *)&local_3e8,"opdataset set active --nwk other --import absent.json",
                       (allocator *)&local_3a0);
            ot::commissioner::Interpreter::ParseExpression
                      ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)&local_3e8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign(&expr,&gtest_ar_);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar_);
            std::__cxx11::string::~string((string *)&local_3e8);
            ot::commissioner::Interpreter::Eval(&local_3e8,&ctx.mInterpreter,&expr);
            ot::commissioner::Interpreter::Value::operator=(&value,&local_3e8);
            ot::commissioner::Interpreter::Value::~Value(&local_3e8);
            bVar2 = ot::commissioner::Interpreter::Value::HasNoError(&value);
            gtest_ar_.success_ = !bVar2;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (bVar2) {
              testing::Message::Message((Message *)&local_3a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&local_3e8,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,
                         "true","false",expected_predicate_value);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_380,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                         ,0xb5b,(char *)CONCAT71(local_3e8.mError._1_7_,
                                                 (undefined1)local_3e8.mError.mCode));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_380,(Message *)&local_3a0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_380);
              std::__cxx11::string::~string((string *)&local_3e8);
              if ((long *)local_3a0._M_dataplus._M_p != (long *)0x0) {
                (**(code **)(*(long *)local_3a0._M_dataplus._M_p + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            ot::commissioner::Interpreter::Value::~Value(&value);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&expr);
          }
          ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&br);
          goto LAB_0017ce73;
        }
        testing::Message::Message((Message *)&br);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&value,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xb4e,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
        this_01 = &gtest_ar_1.message_;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
        if ((long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) != (long *)0x0
           ) {
          (**(code **)(*(long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) +
                      8))();
        }
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_01);
LAB_0017ce73:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNI_ImportOtherNetworksFail)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.3", 20003, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);

    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _)).Times(0);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("opdataset set active --nwk other --import absent.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());
}